

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indexed_indirect_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1ded20::CpuIndexedIndirectTest::run_instruction
          (CpuIndexedIndirectTest *this,uint8_t instruction)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  uchar uVar2;
  uint16_t uVar3;
  int iVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  int *piVar6;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar7;
  uchar *__p;
  char cVar8;
  _func_int *message;
  AssertionResult gtest_ar;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _Any_data local_80;
  code *local_70;
  undefined1 local_60 [8];
  MatcherBase<unsigned_short> local_58;
  MatcherBase<unsigned_short> local_40;
  
  uVar3 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar3;
  (this->super_CpuTest).registers.pc = uVar3;
  (this->super_CpuTest).expected.x = 0xed;
  (this->super_CpuTest).registers.x = 0xed;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 1;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_40,*(short *)&(this->super_CpuTest).field_0x112 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                      ,0x15,"mmu","read_byte(start_pc + 1u)");
  piVar6 = (int *)operator_new(4);
  *piVar6 = 0xab;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar6);
  pAVar7 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *piVar6;
  *(int *)&pAVar7[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar7[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar7);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0xab);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                      ,0x16,"mmu","read_byte(0xAB)");
  piVar6 = (int *)operator_new(4);
  *piVar6 = 0x68;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar6);
  pAVar7 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *piVar6;
  *(int *)&pAVar7[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar7[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar7);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0x98);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                      ,0x17,"mmu","read_byte(u16_to_u8(0xAB + 0xED))");
  piVar6 = (int *)operator_new(4);
  *piVar6 = 0x34;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar6);
  pAVar7 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *piVar6;
  *(int *)&pAVar7[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar7[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar7);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0x99);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                      ,0x19,"mmu","read_byte(u16_to_u8(0xAB + 0xED + 1u))");
  piVar6 = (int *)operator_new(4);
  *piVar6 = 0x12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar6);
  pAVar7 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *piVar6;
  *(int *)&pAVar7[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar7[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar7);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0x1234);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                      ,0x1b,"mmu","read_byte(0x1234)");
  uVar2 = (this->super_CpuTest).field_0x114;
  __p = (uchar *)operator_new(1);
  *__p = uVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_char*>(&local_88,__p);
  pAVar7 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a11a0;
  uVar2 = *__p;
  *(uchar *)&pAVar7[1]._vptr_ActionInterface = uVar2;
  *(uchar *)((long)&pAVar7[1]._vptr_ActionInterface + 1) = uVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar7);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  cVar8 = '\x06';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar8 = cVar8 + -1;
  } while (cVar8 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_60,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
               ,0x1e,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_80._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_80._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

void run_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        registers.x = expected.x = 0xED;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0xAB));
        EXPECT_CALL(mmu, read_byte(0xAB)).WillOnce(Return(0x68)); // Dummy read
        EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED)))
                .WillOnce(Return(0x34));
        EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED + 1u)))
                .WillOnce(Return(0x12));
        EXPECT_CALL(mmu, read_byte(0x1234)).WillOnce(Return(memory_content));

        step_execution(6);
        EXPECT_EQ(expected, registers);
    }